

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.H
# Opt level: O0

Array<int,_3> __thiscall amrex::Geometry::setPeriodicity(Geometry *this,Array<int,_3> *period)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  ulong uVar4;
  const_reference pvVar5;
  size_type in_RDI;
  Array<int,_3> AVar6;
  Array<int,_3> r;
  array<int,_3UL> *in_stack_ffffffffffffffd0;
  undefined8 uVar7;
  
  bVar1 = *(byte *)(in_RDI + 0x51);
  uVar2 = *(undefined1 *)(in_RDI + 0x52);
  bVar3 = *(byte *)(in_RDI + 0x53);
  pvVar5 = std::array<int,_3UL>::operator[](in_stack_ffffffffffffffd0,in_RDI);
  *(bool *)(in_RDI + 0x51) = *pvVar5 != 0;
  pvVar5 = std::array<int,_3UL>::operator[](in_stack_ffffffffffffffd0,in_RDI);
  *(bool *)(in_RDI + 0x52) = *pvVar5 != 0;
  pvVar5 = std::array<int,_3UL>::operator[](in_stack_ffffffffffffffd0,in_RDI);
  *(bool *)(in_RDI + 0x53) = *pvVar5 != 0;
  uVar4 = (ulong)CONCAT14(uVar2,(uint)bVar1) & 0x100000001;
  AVar6._M_elems[0] = (int)uVar4;
  uVar7._4_4_ = (int)(uVar4 >> 0x20);
  AVar6._M_elems[2] = bVar3 & 1;
  return (Array<int,_3>)AVar6._M_elems;
}

Assistant:

Array<int,AMREX_SPACEDIM>
    setPeriodicity (Array<int,AMREX_SPACEDIM> const& period) noexcept {
        Array<int,AMREX_SPACEDIM> r{{AMREX_D_DECL(is_periodic[0],
                                                  is_periodic[1],
                                                  is_periodic[2])}};
        AMREX_D_TERM(is_periodic[0] = period[0];,
                     is_periodic[1] = period[1];,
                     is_periodic[2] = period[2];);
        return r;
    }